

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_598a4::CpuAbsoluteIndexedTest_eor_absx_without_page_crossing_Test::
~CpuAbsoluteIndexedTest_eor_absx_without_page_crossing_Test
          (CpuAbsoluteIndexedTest_eor_absx_without_page_crossing_Test *this)

{
  CpuAbsoluteIndexedTest_eor_absx_without_page_crossing_Test *this_local;
  
  CpuAbsoluteIndexedTest::~CpuAbsoluteIndexedTest(&this->super_CpuAbsoluteIndexedTest);
  return;
}

Assistant:

TEST_F(CpuAbsoluteIndexedTest, eor_absx_without_page_crossing) {
    registers.pc = expected.pc = 0x4321;
    registers.a = 0b11111100;
    registers.p = Z_FLAG | N_FLAG;
    expected.a = 0b00110011;
    memory_content = 0b11001111;

    run_read_instruction_without_pagecrossing(EOR_ABSX, IndexReg::X);
}